

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void wait_child(int signo)

{
  __pid_t _Var1;
  int wstatus;
  int local_c;
  
  do {
    _Var1 = waitpid(0,&local_c,1);
  } while (0 < _Var1);
  return;
}

Assistant:

void wait_child(int signo) {
    pid_t pid;
    int wstatus;
    while ((pid = waitpid(0, &wstatus, WNOHANG)) > 0) {
        /*
        if (WIFEXITED(wstatus)) {
            cout << "process[" << pid << "] exited with " << WEXITSTATUS(wstatus) << endl;
        } else {
            cout << "process[" << pid << "] was terminated by signal " << WTERMSIG(wstatus) << endl;
        }
         */
    }

}